

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
          (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this,
          Exception *exception)

{
  Exception *params;
  Own<kj::_::ImmediateBrokenPromiseNode> local_38;
  Own<kj::_::PromiseNode> local_28;
  Exception *local_18;
  Exception *exception_local;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this_local;
  
  local_18 = exception;
  exception_local = (Exception *)this;
  params = mv<kj::Exception>(exception);
  heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_38,params);
  Own<kj::_::PromiseNode>::Own<kj::_::ImmediateBrokenPromiseNode,void>(&local_28,&local_38);
  _::PromiseBase::PromiseBase(&this->super_PromiseBase,&local_28);
  Own<kj::_::PromiseNode>::~Own(&local_28);
  Own<kj::_::ImmediateBrokenPromiseNode>::~Own(&local_38);
  return;
}

Assistant:

Promise<T>::Promise(kj::Exception&& exception)
    : PromiseBase(heap<_::ImmediateBrokenPromiseNode>(kj::mv(exception))) {}